

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_svc_vui_parameters_extension(sps_svc_ext_t *sps_svc_ext,bs_t *b)

{
  uint uVar1;
  uint32_t uVar2;
  int i;
  ulong uVar3;
  hrd_t *hrd;
  
  uVar1 = bs_read_ue(b);
  (sps_svc_ext->vui).vui_ext_num_entries_minus1 = (unsigned_short)uVar1;
  hrd = sps_svc_ext->hrd_vcl;
  for (uVar3 = 0; uVar3 <= (uVar1 & 0xffff); uVar3 = uVar3 + 1) {
    uVar2 = bs_read_u(b,3);
    (sps_svc_ext->vui).vui_ext_dependency_id[uVar3] = (uchar)uVar2;
    uVar2 = bs_read_u(b,4);
    (sps_svc_ext->vui).vui_ext_quality_id[uVar3] = (uchar)uVar2;
    uVar2 = bs_read_u(b,3);
    (sps_svc_ext->vui).vui_ext_temporal_id[uVar3] = (uchar)uVar2;
    uVar2 = bs_read_u1(b);
    (sps_svc_ext->vui).vui_ext_timing_info_present_flag[uVar3] = (uchar)uVar2;
    if (uVar2 != 0) {
      uVar2 = bs_read_u(b,0x20);
      (sps_svc_ext->vui).vui_ext_num_units_in_tick[uVar3] = uVar2;
      uVar2 = bs_read_u(b,0x20);
      (sps_svc_ext->vui).vui_ext_time_scale[uVar3] = uVar2;
      uVar2 = bs_read_u1(b);
      (sps_svc_ext->vui).vui_ext_fixed_frame_rate_flag[uVar3] = SUB41(uVar2,0);
    }
    uVar2 = bs_read_u1(b);
    (sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[uVar3] = SUB41(uVar2,0);
    if (uVar2 != 0) {
      read_hrd_parameters(hrd,b);
    }
    uVar2 = bs_read_u1(b);
    (sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[uVar3] = SUB41(uVar2,0);
    if (uVar2 != 0) {
      read_hrd_parameters(hrd + -0x80,b);
    }
    if (((sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[uVar3] != false) ||
       ((sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[uVar3] == true)) {
      uVar2 = bs_read_u1(b);
      (sps_svc_ext->vui).vui_ext_low_delay_hrd_flag[uVar3] = SUB41(uVar2,0);
    }
    uVar2 = bs_read_u1(b);
    (sps_svc_ext->vui).vui_ext_pic_struct_present_flag[uVar3] = SUB41(uVar2,0);
    uVar1 = (uint)(sps_svc_ext->vui).vui_ext_num_entries_minus1;
    hrd = hrd + 1;
  }
  return;
}

Assistant:

void read_svc_vui_parameters_extension(sps_svc_ext_t* sps_svc_ext, bs_t* b)
{
    sps_svc_ext->vui.vui_ext_num_entries_minus1 = bs_read_ue(b);
    for( int i = 0; i <= sps_svc_ext->vui.vui_ext_num_entries_minus1; i++ )
    {
        sps_svc_ext->vui.vui_ext_dependency_id[i] = bs_read_u(b, 3);
        sps_svc_ext->vui.vui_ext_quality_id[i] = bs_read_u(b, 4);
        sps_svc_ext->vui.vui_ext_temporal_id[i] = bs_read_u(b, 3);
        sps_svc_ext->vui.vui_ext_timing_info_present_flag[i] = bs_read_u1(b);
        if( sps_svc_ext->vui.vui_ext_timing_info_present_flag[i] )
        {
            sps_svc_ext->vui.vui_ext_num_units_in_tick[i] = bs_read_u(b, 32);
            sps_svc_ext->vui.vui_ext_time_scale[i] = bs_read_u(b, 32);
            sps_svc_ext->vui.vui_ext_fixed_frame_rate_flag[i] = bs_read_u1(b);
        }

        sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] = bs_read_u1(b);
        if( sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] )
        {
            read_hrd_parameters(&sps_svc_ext->hrd_vcl[i], b);
        }
        sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] = bs_read_u1(b);
        if( sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] )
        {
            read_hrd_parameters(&sps_svc_ext->hrd_nal[i], b);
        }
        
        if( sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] ||
            sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] )
        {
            sps_svc_ext->vui.vui_ext_low_delay_hrd_flag[i] = bs_read_u1(b);
        }
        sps_svc_ext->vui.vui_ext_pic_struct_present_flag[i] = bs_read_u1(b);
    }
}